

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# istack.c
# Opt level: O0

void PopIStack(TidyDocImpl *doc)

{
  uint uVar1;
  Lexer *pLVar2;
  IStack *pIVar3;
  AttVal *av_00;
  AttVal *av;
  IStack *istack;
  Lexer *lexer;
  TidyDocImpl *doc_local;
  
  pLVar2 = doc->lexer;
  pLVar2->istacksize = pLVar2->istacksize - 1;
  pIVar3 = pLVar2->istack;
  uVar1 = pLVar2->istacksize;
  while (pIVar3[uVar1].attributes != (AttVal *)0x0) {
    av_00 = pIVar3[uVar1].attributes;
    pIVar3[uVar1].attributes = av_00->next;
    prvTidyFreeAttribute(doc,av_00);
  }
  (*doc->allocator->vtbl->free)(doc->allocator,pIVar3[uVar1].element);
  pIVar3[uVar1].element = (tmbstr)0x0;
  return;
}

Assistant:

static void PopIStack( TidyDocImpl* doc )
{
    Lexer* lexer = doc->lexer;
    IStack *istack;
    AttVal *av;

    --(lexer->istacksize);
    istack = &(lexer->istack[lexer->istacksize]);

    while (istack->attributes)
    {
        av = istack->attributes;
        istack->attributes = av->next;
        TY_(FreeAttribute)( doc, av );
    }
    TidyDocFree(doc, istack->element);
    istack->element = NULL; /* remove the freed element */
}